

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall BigNum::BigNum(BigNum *this,int i)

{
  __cxx11 local_58 [32];
  BigNum local_38;
  int local_14;
  BigNum *pBStack_10;
  int i_local;
  BigNum *this_local;
  
  local_14 = i;
  pBStack_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->digits);
  this->sign = true;
  std::__cxx11::to_string(local_58,local_14);
  BigNum(&local_38,(string *)local_58);
  setBigNum(this,&local_38);
  ~BigNum(&local_38);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

BigNum(int i) {
        setBigNum(BigNum(std::to_string(i)));
    }